

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void __thiscall cppnet::PoolAlloter::Free(PoolAlloter *this,void **data,uint32_t len)

{
  value_type pMVar1;
  uint32_t uVar2;
  element_type *peVar3;
  reference ppMVar4;
  MemNode **my_free;
  MemNode *node;
  uint32_t len_local;
  void **data_local;
  PoolAlloter *this_local;
  
  if (*data != (void *)0x0) {
    if (len < 0x101) {
      pMVar1 = (value_type)*data;
      uVar2 = FreeListIndex(this,len,8);
      ppMVar4 = std::
                vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
                ::operator[](&this->_free_list,(ulong)uVar2);
      pMVar1->_next = *ppMVar4;
      *ppMVar4 = pMVar1;
      *data = (void *)0x0;
    }
    else {
      peVar3 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_alloter);
      (*peVar3->_vptr_Alloter[5])(peVar3,data,0);
      *data = (void *)0x0;
    }
  }
  return;
}

Assistant:

void PoolAlloter::Free(void* &data, uint32_t len) {
    if (!data) {
        return;
    }
    
    if (len > __default_max_bytes) {
        _alloter->Free(data);
        data = nullptr;
        return;
    }

#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    MemNode* node = (MemNode*)data;
    MemNode** my_free = &(_free_list[FreeListIndex(len)]);
    
    node->_next = *my_free;
    *my_free = node;
    data = nullptr;
}